

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O1

void Imf_2_5::anon_unknown_9::dctInverse8x8_scalar<7>(float *data)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  
  fVar4 = (*data + data[4]) * 0.35355362;
  fVar5 = (*data - data[4]) * 0.35355362;
  fVar10 = data[2] * 0.19134216 - data[6] * 0.46193984;
  fVar7 = data[6] * 0.19134216 + data[2] * 0.46193984;
  fVar8 = data[3];
  fVar9 = data[1];
  fVar18 = data[5];
  fVar6 = data[7];
  fVar12 = fVar6 * 0.097545706 + fVar18 * 0.27778545 + fVar9 * 0.49039266 + fVar8 * 0.41573495;
  fVar14 = fVar6 * -0.27778545 + fVar18 * -0.49039266 + fVar9 * 0.41573495 + fVar8 * -0.097545706;
  fVar16 = fVar6 * 0.41573495 + fVar18 * 0.097545706 + fVar9 * 0.27778545 + fVar8 * -0.49039266;
  fVar18 = fVar6 * -0.49039266 + fVar18 * 0.41573495 + fVar9 * 0.097545706 + fVar8 * -0.27778545;
  fVar8 = fVar10 + fVar5;
  fVar9 = fVar7 + fVar4;
  fVar4 = fVar4 - fVar7;
  fVar5 = fVar5 - fVar10;
  *data = fVar12 + fVar9;
  data[1] = fVar14 + fVar8;
  data[2] = fVar16 + fVar5;
  data[3] = fVar18 + fVar4;
  data[4] = fVar4 - fVar18;
  data[5] = fVar5 - fVar16;
  data[6] = fVar8 - fVar14;
  data[7] = fVar9 - fVar12;
  lVar3 = -8;
  do {
    pfVar1 = data + lVar3 + 0x10;
    fVar8 = *pfVar1;
    fVar9 = pfVar1[1];
    fVar18 = pfVar1[2];
    fVar6 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x18;
    pfVar2 = data + lVar3 + 0x20;
    fVar4 = *pfVar2;
    fVar5 = pfVar2[1];
    fVar7 = pfVar2[2];
    fVar10 = pfVar2[3];
    pfVar2 = data + lVar3 + 0x38;
    fVar28 = *pfVar1 * 0.19134216 - *pfVar2 * 0.46193984;
    fVar29 = pfVar1[1] * 0.19134216 - pfVar2[1] * 0.46193984;
    fVar30 = pfVar1[2] * 0.19134216 - pfVar2[2] * 0.46193984;
    fVar31 = pfVar1[3] * 0.19134216 - pfVar2[3] * 0.46193984;
    fVar32 = *pfVar2 * 0.19134216 + *pfVar1 * 0.46193984;
    fVar33 = pfVar2[1] * 0.19134216 + pfVar1[1] * 0.46193984;
    fVar34 = pfVar2[2] * 0.19134216 + pfVar1[2] * 0.46193984;
    fVar35 = pfVar2[3] * 0.19134216 + pfVar1[3] * 0.46193984;
    pfVar1 = data + lVar3 + 0x30;
    fVar12 = *pfVar1;
    fVar14 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar11 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x40;
    fVar13 = *pfVar1;
    fVar15 = pfVar1[1];
    fVar17 = pfVar1[2];
    fVar19 = pfVar1[3];
    fVar24 = fVar13 * 0.097545706 + fVar12 * 0.27778545 + fVar8 * 0.49039266 + fVar4 * 0.41573495;
    fVar25 = fVar15 * 0.097545706 + fVar14 * 0.27778545 + fVar9 * 0.49039266 + fVar5 * 0.41573495;
    fVar26 = fVar17 * 0.097545706 + fVar16 * 0.27778545 + fVar18 * 0.49039266 + fVar7 * 0.41573495;
    fVar27 = fVar19 * 0.097545706 + fVar11 * 0.27778545 + fVar6 * 0.49039266 + fVar10 * 0.41573495;
    fVar40 = fVar13 * -0.27778545 + fVar12 * -0.49039266 + fVar8 * 0.41573495 + fVar4 * -0.097545706
    ;
    fVar41 = fVar15 * -0.27778545 + fVar14 * -0.49039266 + fVar9 * 0.41573495 + fVar5 * -0.097545706
    ;
    fVar42 = fVar17 * -0.27778545 +
             fVar16 * -0.49039266 + fVar18 * 0.41573495 + fVar7 * -0.097545706;
    fVar43 = fVar19 * -0.27778545 +
             fVar11 * -0.49039266 + fVar6 * 0.41573495 + fVar10 * -0.097545706;
    fVar20 = fVar13 * 0.41573495 + fVar12 * 0.097545706 + fVar8 * 0.27778545 + fVar4 * -0.49039266;
    fVar21 = fVar15 * 0.41573495 + fVar14 * 0.097545706 + fVar9 * 0.27778545 + fVar5 * -0.49039266;
    fVar22 = fVar17 * 0.41573495 + fVar16 * 0.097545706 + fVar18 * 0.27778545 + fVar7 * -0.49039266;
    fVar23 = fVar19 * 0.41573495 + fVar11 * 0.097545706 + fVar6 * 0.27778545 + fVar10 * -0.49039266;
    pfVar1 = data + lVar3 + 8;
    fVar36 = fVar13 * -0.49039266 + fVar12 * 0.41573495 + fVar8 * 0.097545706 + fVar4 * -0.27778545;
    fVar37 = fVar15 * -0.49039266 + fVar14 * 0.41573495 + fVar9 * 0.097545706 + fVar5 * -0.27778545;
    fVar38 = fVar17 * -0.49039266 + fVar16 * 0.41573495 + fVar18 * 0.097545706 + fVar7 * -0.27778545
    ;
    fVar39 = fVar19 * -0.49039266 + fVar11 * 0.41573495 + fVar6 * 0.097545706 + fVar10 * -0.27778545
    ;
    pfVar2 = data + lVar3 + 0x28;
    fVar4 = (*pfVar1 + *pfVar2) * 0.35355362;
    fVar5 = (pfVar1[1] + pfVar2[1]) * 0.35355362;
    fVar7 = (pfVar1[2] + pfVar2[2]) * 0.35355362;
    fVar10 = (pfVar1[3] + pfVar2[3]) * 0.35355362;
    fVar12 = (*pfVar1 - *pfVar2) * 0.35355362;
    fVar14 = (pfVar1[1] - pfVar2[1]) * 0.35355362;
    fVar16 = (pfVar1[2] - pfVar2[2]) * 0.35355362;
    fVar11 = (pfVar1[3] - pfVar2[3]) * 0.35355362;
    fVar8 = fVar28 + fVar12;
    fVar9 = fVar29 + fVar14;
    fVar18 = fVar30 + fVar16;
    fVar6 = fVar31 + fVar11;
    fVar12 = fVar12 - fVar28;
    fVar14 = fVar14 - fVar29;
    fVar16 = fVar16 - fVar30;
    fVar11 = fVar11 - fVar31;
    fVar13 = fVar32 + fVar4;
    fVar15 = fVar33 + fVar5;
    fVar17 = fVar34 + fVar7;
    fVar19 = fVar35 + fVar10;
    fVar4 = fVar4 - fVar32;
    fVar5 = fVar5 - fVar33;
    fVar7 = fVar7 - fVar34;
    fVar10 = fVar10 - fVar35;
    pfVar1 = data + lVar3 + 8;
    *pfVar1 = fVar24 + fVar13;
    pfVar1[1] = fVar25 + fVar15;
    pfVar1[2] = fVar26 + fVar17;
    pfVar1[3] = fVar27 + fVar19;
    pfVar1 = data + lVar3 + 0x10;
    *pfVar1 = fVar40 + fVar8;
    pfVar1[1] = fVar41 + fVar9;
    pfVar1[2] = fVar42 + fVar18;
    pfVar1[3] = fVar43 + fVar6;
    pfVar1 = data + lVar3 + 0x18;
    *pfVar1 = fVar20 + fVar12;
    pfVar1[1] = fVar21 + fVar14;
    pfVar1[2] = fVar22 + fVar16;
    pfVar1[3] = fVar23 + fVar11;
    pfVar1 = data + lVar3 + 0x20;
    *pfVar1 = fVar36 + fVar4;
    pfVar1[1] = fVar37 + fVar5;
    pfVar1[2] = fVar38 + fVar7;
    pfVar1[3] = fVar39 + fVar10;
    pfVar1 = data + lVar3 + 0x28;
    *pfVar1 = fVar4 - fVar36;
    pfVar1[1] = fVar5 - fVar37;
    pfVar1[2] = fVar7 - fVar38;
    pfVar1[3] = fVar10 - fVar39;
    pfVar1 = data + lVar3 + 0x30;
    *pfVar1 = fVar12 - fVar20;
    pfVar1[1] = fVar14 - fVar21;
    pfVar1[2] = fVar16 - fVar22;
    pfVar1[3] = fVar11 - fVar23;
    pfVar1 = data + lVar3 + 0x38;
    *pfVar1 = fVar8 - fVar40;
    pfVar1[1] = fVar9 - fVar41;
    pfVar1[2] = fVar18 - fVar42;
    pfVar1[3] = fVar6 - fVar43;
    pfVar1 = data + lVar3 + 0x40;
    *pfVar1 = fVar13 - fVar24;
    pfVar1[1] = fVar15 - fVar25;
    pfVar1[2] = fVar17 - fVar26;
    pfVar1[3] = fVar19 - fVar27;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  return;
}

Assistant:

void
dctInverse8x8_scalar (float *data)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f*3.14159f / 16.0f);
    const float e = .5f * cosf (5.f*3.14159f / 16.0f);
    const float f = .5f * cosf (3.f*3.14159f / 8.0f);
    const float g = .5f * cosf (7.f*3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float *rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2]; 
        alpha[1] = f * rowPtr[2]; 
        alpha[2] = c * rowPtr[6]; 
        alpha[3] = f * rowPtr[6]; 

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 


        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];


        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16+column]; 
        alpha[1] = f * data[16+column]; 
        alpha[2] = c * data[48+column]; 
        alpha[3] = f * data[48+column]; 

        beta[0] = b * data[8+column]  + d * data[24+column] +
                  e * data[40+column] + g * data[56+column];

        beta[1] = d * data[8+column]  - g * data[24+column] -
                  b * data[40+column] - e * data[56+column];

        beta[2] = e * data[8+column]  - b * data[24+column] + 
                  g * data[40+column] + d * data[56+column];

        beta[3] = g * data[8+column]  - e * data[24+column] + 
                  d * data[40+column] - b * data[56+column];

        theta[0] = a * (data[column] + data[32+column]);
        theta[3] = a * (data[column] - data[32+column]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[     column] = gamma[0] + beta[0];
        data[ 8 + column] = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}